

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowcontainer.cpp
# Opt level: O0

void __thiscall
QWindowContainer::QWindowContainer
          (QWindowContainer *this,QWindow *embeddedWindow,QWidget *parent,WindowFlags flags)

{
  bool bVar1;
  QWindowContainerPrivate *pQVar2;
  QWindow *pQVar3;
  QObject *pQVar4;
  undefined4 in_ECX;
  offset_in_QWindow_to_subr in_RDX;
  long in_RSI;
  offset_in_QWidget_to_subr *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QWindowContainerPrivate *d;
  QString windowName;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  undefined1 on;
  undefined4 in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  QWidgetPrivate *in_stack_fffffffffffffe88;
  QStringBuilder<QString_&,_QLatin1String> *c;
  QWidget *in_stack_fffffffffffffe90;
  QAnyStringView *this_00;
  undefined8 in_stack_fffffffffffffe98;
  QFlagsStorage<Qt::WindowType> f;
  ContextType *in_stack_fffffffffffffec8;
  Object *in_stack_fffffffffffffed0;
  ConnectionType in_stack_ffffffffffffff10;
  Connection local_e8;
  code *local_e0;
  undefined8 local_d8;
  Connection local_d0 [4];
  QLatin1StringView local_b0;
  QStringBuilder<QString_&,_QLatin1String> local_a0;
  undefined8 local_78;
  storage_type *local_70;
  undefined1 local_60 [24];
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  char local_30 [32];
  undefined4 local_10;
  undefined4 local_c;
  long local_8;
  
  f.i = (Int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_ECX;
  operator_new(0x298);
  QWindowContainerPrivate::QWindowContainerPrivate
            ((QWindowContainerPrivate *)
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  local_10 = local_c;
  QWidget::QWidget(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                   (QWidget *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   (WindowFlags)f.i);
  *in_RDI = (offset_in_QWidget_to_subr)&PTR_metaObject_00d090c0;
  in_RDI[2] = (offset_in_QWidget_to_subr)&PTR__QWindowContainer_00d09270;
  pQVar2 = d_func((QWindowContainer *)0x3ba2de);
  if (in_RSI == 0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88,
               in_stack_fffffffffffffe84,
               (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    QMessageLogger::warning(local_30,"QWindowContainer: embedded window cannot be null");
  }
  else {
    QPointer<QWindow>::operator=
              ((QPointer<QWindow> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               (QWindow *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    pQVar3 = QPointer<QWindow>::operator->((QPointer<QWindow> *)0x3ba356);
    QObject::installEventFilter((QObject *)pQVar3);
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    QPointer<QWindow>::operator->((QPointer<QWindow> *)0x3ba3a1);
    QObject::objectName();
    bVar1 = QString::isEmpty((QString *)0x3ba3be);
    if (bVar1) {
      pQVar3 = QPointer<QWindow>::operator->((QPointer<QWindow> *)0x3ba3d5);
      (*(code *)**(undefined8 **)pQVar3)();
      local_78 = QMetaObject::className();
      QByteArrayView::QByteArrayView<const_char_*,_true>
                ((QByteArrayView *)in_stack_fffffffffffffe90,(char **)in_stack_fffffffffffffe88);
      QVar5.m_data = local_70;
      QVar5.m_size = (qsizetype)local_60;
      QString::fromUtf8(QVar5);
      QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                         (QString *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      QString::~QString((QString *)0x3ba441);
    }
    this_00 = (QAnyStringView *)&pQVar2->fakeParent;
    local_b0 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffffe88,
                          CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    c = &local_a0;
    ::operator+((QString *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                (QLatin1String *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    on = (undefined1)((uint)in_stack_fffffffffffffe7c >> 0x18);
    QString::QString((QString *)0x3ba4a6);
    QAnyStringView::QAnyStringView<QStringBuilder<QString_&,_QLatin1String>,_true>
              (this_00,c,
               (wrapped_t<QStringBuilder<QString_&,_QLatin1String>,_QString> *)
               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    QObject::setObjectName((QAnyStringView *)this_00);
    QString::~QString((QString *)0x3ba4e1);
    pQVar3 = QPointer<QWindow>::operator->((QPointer<QWindow> *)0x3ba4f2);
    QWindow::setParent(pQVar3);
    pQVar3 = QPointer<QWindow>::operator->((QPointer<QWindow> *)0x3ba517);
    pQVar4 = (QObject *)QWindow::parent(pQVar3,0);
    QObject::installEventFilter(pQVar4);
    pQVar3 = QPointer<QWindow>::operator->((QPointer<QWindow> *)0x3ba53f);
    QWindow::setFlag((WindowType)pQVar3,true);
    QWidget::setAcceptDrops
              ((QWidget *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),(bool)on);
    containedWindow((QWindowContainer *)
                    CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    local_e0 = QWidget::updateGeometry;
    local_d8 = 0;
    QObject::connect<void(QWindow::*)(int),void(QWidget::*)()>
              (in_stack_fffffffffffffed0,in_RDX,in_stack_fffffffffffffec8,in_RDI,
               in_stack_ffffffffffffff10);
    QMetaObject::Connection::~Connection(local_d0);
    containedWindow((QWindowContainer *)
                    CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    QObject::connect<void(QWindow::*)(int),void(QWidget::*)()>
              ((Object *)0x0,in_RDX,(ContextType *)QWindow::minimumWidthChanged,in_RDI,
               AutoConnection);
    QMetaObject::Connection::~Connection(&local_e8);
    QString::~QString((QString *)0x3ba663);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QWindowContainer::QWindowContainer(QWindow *embeddedWindow, QWidget *parent, Qt::WindowFlags flags)
    : QWidget(*new QWindowContainerPrivate, parent, flags)
{
    Q_D(QWindowContainer);
    if (Q_UNLIKELY(!embeddedWindow)) {
        qWarning("QWindowContainer: embedded window cannot be null");
        return;
    }

    d->window = embeddedWindow;
    d->window->installEventFilter(this);

    QString windowName = d->window->objectName();
    if (windowName.isEmpty())
        windowName = QString::fromUtf8(d->window->metaObject()->className());
    d->fakeParent.setObjectName(windowName + "ContainerFakeParent"_L1);

    d->window->setParent(&d->fakeParent);
    d->window->parent()->installEventFilter(this);
    d->window->setFlag(Qt::SubWindow);

    setAcceptDrops(true);

    connect(containedWindow(), &QWindow::minimumHeightChanged, this, &QWindowContainer::updateGeometry);
    connect(containedWindow(), &QWindow::minimumWidthChanged, this, &QWindowContainer::updateGeometry);
}